

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_oh_replace_stream_data
               (qpdf_data qpdf,qpdf_oh stream_oh,uchar *buf,size_t len,qpdf_oh filter_oh,
               qpdf_oh decode_parms_oh)

{
  anon_class_32_5_c8457945 local_70;
  function<void_(QPDFObjectHandle_&)> local_50;
  qpdf_oh local_30;
  qpdf_oh local_2c;
  qpdf_oh decode_parms_oh_local;
  qpdf_oh filter_oh_local;
  size_t len_local;
  uchar *buf_local;
  qpdf_data p_Stack_10;
  qpdf_oh stream_oh_local;
  qpdf_data qpdf_local;
  
  local_70.qpdf = qpdf;
  local_70.buf = buf;
  local_70.len = len;
  local_70.filter_oh = filter_oh;
  local_70.decode_parms_oh = decode_parms_oh;
  local_30 = decode_parms_oh;
  local_2c = filter_oh;
  _decode_parms_oh_local = len;
  len_local = (size_t)buf;
  buf_local._4_4_ = stream_oh;
  p_Stack_10 = qpdf;
  std::function<void(QPDFObjectHandle&)>::function<qpdf_oh_replace_stream_data::__0,void>
            ((function<void(QPDFObjectHandle&)> *)&local_50,&local_70);
  do_with_oh_void(qpdf,stream_oh,&local_50);
  std::function<void_(QPDFObjectHandle_&)>::~function(&local_50);
  return;
}

Assistant:

void
qpdf_oh_replace_stream_data(
    qpdf_data qpdf,
    qpdf_oh stream_oh,
    unsigned char const* buf,
    size_t len,
    qpdf_oh filter_oh,
    qpdf_oh decode_parms_oh)
{
    do_with_oh_void(
        qpdf, stream_oh, [qpdf, buf, len, filter_oh, decode_parms_oh](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_replace_stream_data");
            auto filter = qpdf_oh_item_internal(qpdf, filter_oh);
            auto decode_parms = qpdf_oh_item_internal(qpdf, decode_parms_oh);
            // XXX test with binary data with null
            o.replaceStreamData(
                std::string(reinterpret_cast<char const*>(buf), len), filter, decode_parms);
        });
}